

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O0

void __thiscall Assimp::D3MF::XmlSerializer::ImportTriangles(XmlSerializer *this,aiMesh *mesh)

{
  XmlReader *pXVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 uVar4;
  undefined4 extraout_var_01;
  size_type sVar5;
  ulong *puVar6;
  iterator __first;
  iterator __last;
  aiFace *paVar7;
  ulong uVar8;
  aiFace *local_f0;
  int matIdx;
  char *pidToken;
  allocator local_61;
  string local_60 [8];
  string nodeName;
  undefined1 local_30 [8];
  vector<aiFace,_std::allocator<aiFace>_> faces;
  aiMesh *mesh_local;
  XmlSerializer *this_local;
  
  faces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)mesh;
  std::vector<aiFace,_std::allocator<aiFace>_>::vector
            ((vector<aiFace,_std::allocator<aiFace>_> *)local_30);
  while (bVar2 = ReadToEndElement(this,(string *)XmlTag::triangles_abi_cxx11_), bVar2) {
    iVar3 = (*this->xmlReader->_vptr_IIrrXMLReader[0xd])();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,(char *)CONCAT44(extraout_var,iVar3),&local_61);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    iVar3 = (*this->xmlReader->_vptr_IIrrXMLReader[0xd])();
    bVar2 = std::operator==((char *)CONCAT44(extraout_var_00,iVar3),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            XmlTag::triangle_abi_cxx11_);
    if (bVar2) {
      ReadTriangle((XmlSerializer *)&pidToken);
      std::vector<aiFace,_std::allocator<aiFace>_>::push_back
                ((vector<aiFace,_std::allocator<aiFace>_> *)local_30,(value_type *)&pidToken);
      aiFace::~aiFace((aiFace *)&pidToken);
      pXVar1 = this->xmlReader;
      uVar4 = std::__cxx11::string::c_str();
      iVar3 = (*pXVar1->_vptr_IIrrXMLReader[7])(pXVar1,uVar4);
      if ((char *)CONCAT44(extraout_var_01,iVar3) != (char *)0x0) {
        iVar3 = atoi((char *)CONCAT44(extraout_var_01,iVar3));
        *(int *)&faces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage[0xe].mIndices = iVar3;
      }
    }
    std::__cxx11::string::~string(local_60);
  }
  sVar5 = std::vector<aiFace,_std::allocator<aiFace>_>::size
                    ((vector<aiFace,_std::allocator<aiFace>_> *)local_30);
  *(int *)&(faces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage)->mIndices = (int)sVar5;
  uVar8 = (ulong)*(uint *)&(faces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage)->mIndices;
  puVar6 = (ulong *)operator_new__(uVar8 << 4 | 8);
  *puVar6 = uVar8;
  paVar7 = (aiFace *)(puVar6 + 1);
  if (uVar8 != 0) {
    local_f0 = paVar7;
    do {
      aiFace::aiFace(local_f0);
      local_f0 = local_f0 + 1;
    } while (local_f0 != paVar7 + uVar8);
  }
  *(aiFace **)
   (faces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage + 0xd) = paVar7;
  (faces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage)->mNumIndices = 4;
  __first = std::vector<aiFace,_std::allocator<aiFace>_>::begin
                      ((vector<aiFace,_std::allocator<aiFace>_> *)local_30);
  __last = std::vector<aiFace,_std::allocator<aiFace>_>::end
                     ((vector<aiFace,_std::allocator<aiFace>_> *)local_30);
  std::
  copy<__gnu_cxx::__normal_iterator<aiFace*,std::vector<aiFace,std::allocator<aiFace>>>,aiFace*>
            ((__normal_iterator<aiFace_*,_std::vector<aiFace,_std::allocator<aiFace>_>_>)
             __first._M_current,
             (__normal_iterator<aiFace_*,_std::vector<aiFace,_std::allocator<aiFace>_>_>)
             __last._M_current,
             *(aiFace **)
              (faces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + 0xd));
  std::vector<aiFace,_std::allocator<aiFace>_>::~vector
            ((vector<aiFace,_std::allocator<aiFace>_> *)local_30);
  return;
}

Assistant:

void ImportTriangles(aiMesh* mesh) {
         std::vector<aiFace> faces;

         while(ReadToEndElement(D3MF::XmlTag::triangles)) {
             const std::string nodeName( xmlReader->getNodeName() );
             if(xmlReader->getNodeName() == D3MF::XmlTag::triangle) {
                 faces.push_back(ReadTriangle());
                 const char *pidToken( xmlReader->getAttributeValue( D3MF::XmlTag::p1.c_str() ) );
                 if ( nullptr != pidToken ) {
                     int matIdx( std::atoi( pidToken ) );
                     mesh->mMaterialIndex = matIdx;
                 }
             }
         }

        mesh->mNumFaces = static_cast<unsigned int>(faces.size());
        mesh->mFaces = new aiFace[mesh->mNumFaces];
        mesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

        std::copy(faces.begin(), faces.end(), mesh->mFaces);
    }